

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printers.cpp
# Opt level: O3

void printEvents(istream *input,ostream *output,string *format,string *dateFormat)

{
  pointer pcVar1;
  Event *event;
  initializer_list<unsigned_long> __l;
  initializer_list<std::vector<binlog::EventSource,_std::allocator<binlog::EventSource>_>_> __l_00;
  IstreamEntryStream entryStream;
  PrettyPrinter pp;
  EventStream eventStream;
  allocator_type local_1b1;
  string local_1b0;
  string local_190;
  IstreamEntryStream local_170;
  undefined1 local_148 [32];
  _Alloc_hider local_128;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_118 [2];
  EventStream local_f0;
  
  binlog::IstreamEntryStream::IstreamEntryStream(&local_170,input);
  local_148._0_8_ = (pointer)0x0;
  __l._M_len = 1;
  __l._M_array = (iterator)local_148;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_f0,__l,&local_1b1);
  local_148._0_8_ = (pointer)0x0;
  local_148._8_8_ = (pointer)0x0;
  local_148._16_8_ = (pointer)0x0;
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)local_148;
  std::
  vector<std::vector<binlog::EventSource,_std::allocator<binlog::EventSource>_>,_std::allocator<std::vector<binlog::EventSource,_std::allocator<binlog::EventSource>_>_>_>
  ::vector(&local_f0._eventSources._segments,__l_00,(allocator_type *)&local_1b1);
  std::vector<binlog::EventSource,_std::allocator<binlog::EventSource>_>::~vector
            ((vector<binlog::EventSource,_std::allocator<binlog::EventSource>_> *)local_148);
  local_f0._writerProp.name._M_dataplus._M_p = (pointer)&local_f0._writerProp.name.field_2;
  local_f0._writerProp.id = 0;
  local_f0._writerProp.name._M_string_length = 0;
  local_f0._writerProp.name.field_2._M_local_buf[0] = '\0';
  local_f0._clockSync.tzName._M_dataplus._M_p = (pointer)((long)&local_f0._clockSync.tzName + 0x10);
  local_f0._writerProp.batchSize = 0;
  local_f0._clockSync.clockValue = 0;
  local_f0._clockSync.clockFrequency = 0;
  local_f0._clockSync.nsSinceEpoch = 0;
  local_f0._clockSync.tzOffset = 0;
  local_f0._clockSync.tzName._M_string_length = 0;
  local_f0._clockSync.tzName.field_2._M_local_buf[0] = '\0';
  local_f0._event.source = (EventSource *)0x0;
  local_f0._event.clockValue = 0;
  local_f0._event.arguments._begin = (char *)0x0;
  local_f0._event.arguments._end = (char *)0x0;
  pcVar1 = (format->_M_dataplus)._M_p;
  local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_190,pcVar1,pcVar1 + format->_M_string_length);
  pcVar1 = (dateFormat->_M_dataplus)._M_p;
  local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1b0,pcVar1,pcVar1 + dateFormat->_M_string_length);
  binlog::PrettyPrinter::PrettyPrinter((PrettyPrinter *)local_148,&local_190,&local_1b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
    operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_dataplus._M_p != &local_190.field_2) {
    operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
  }
  while( true ) {
    event = binlog::EventStream::nextEvent(&local_f0,&local_170.super_EntryStream);
    if (event == (Event *)0x0) break;
    binlog::PrettyPrinter::printEvent
              ((PrettyPrinter *)local_148,output,event,&local_f0._writerProp,&local_f0._clockSync);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_p != local_118) {
    operator_delete(local_128._M_p,local_118[0]._M_allocated_capacity + 1);
  }
  if ((pointer)local_148._0_8_ != (pointer)(local_148 + 0x10)) {
    operator_delete((void *)local_148._0_8_,(ulong)(local_148._16_8_ + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._clockSync.tzName._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)((long)&local_f0._clockSync.tzName + 0x10U)) {
    operator_delete(local_f0._clockSync.tzName._M_dataplus._M_p,
                    CONCAT71(local_f0._clockSync.tzName.field_2._M_allocated_capacity._1_7_,
                             local_f0._clockSync.tzName.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._writerProp.name._M_dataplus._M_p != &local_f0._writerProp.name.field_2) {
    operator_delete(local_f0._writerProp.name._M_dataplus._M_p,
                    CONCAT71(local_f0._writerProp.name.field_2._M_allocated_capacity._1_7_,
                             local_f0._writerProp.name.field_2._M_local_buf[0]) + 1);
  }
  std::
  vector<std::vector<binlog::EventSource,_std::allocator<binlog::EventSource>_>,_std::allocator<std::vector<binlog::EventSource,_std::allocator<binlog::EventSource>_>_>_>
  ::~vector(&local_f0._eventSources._segments);
  if (local_f0._eventSources._offsets.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f0._eventSources._offsets.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_f0._eventSources._offsets.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_f0._eventSources._offsets.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_170.super_EntryStream._vptr_EntryStream = (_func_int **)&PTR__IstreamEntryStream_001ebcf8;
  if (local_170._buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_170._buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_170._buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_170._buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void printEvents(std::istream& input, std::ostream& output, const std::string& format, const std::string& dateFormat)
{
  binlog::IstreamEntryStream entryStream(input);
  binlog::EventStream eventStream;
  binlog::PrettyPrinter pp(format, dateFormat);

  while (const binlog::Event* event = eventStream.nextEvent(entryStream))
  {
    pp.printEvent(output, *event, eventStream.writerProp(), eventStream.clockSync());
  }
}